

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_ppmd(archive *a,la_zstream *lastrm,la_zaction action)

{
  int *piVar1;
  undefined1 *puVar2;
  UInt64 UVar3;
  int in_EDX;
  long *in_RSI;
  bool bVar4;
  uint8_t *p;
  ppmd_stream *strm;
  int in_stack_00000124;
  CPpmd7z_RangeEnc *in_stack_00000128;
  CPpmd7 *in_stack_00000130;
  CPpmd7z_RangeEnc *in_stack_ffffffffffffffd0;
  
  piVar1 = (int *)in_RSI[9];
  if (*(long *)(piVar1 + 0x12d0) != 0) {
    in_stack_ffffffffffffffd0 =
         (CPpmd7z_RangeEnc *)(*(long *)(piVar1 + 0x12cc) - *(long *)(piVar1 + 0x12d0));
    while( true ) {
      bVar4 = false;
      if (in_RSI[4] != 0) {
        bVar4 = *(long *)(piVar1 + 0x12d0) != 0;
      }
      if (!bVar4) break;
      UVar3 = in_stack_ffffffffffffffd0->Low;
      puVar2 = (undefined1 *)in_RSI[3];
      in_RSI[3] = (long)(puVar2 + 1);
      *puVar2 = (char)UVar3;
      in_RSI[4] = in_RSI[4] + -1;
      in_RSI[5] = in_RSI[5] + 1;
      *(long *)(piVar1 + 0x12d0) = *(long *)(piVar1 + 0x12d0) + -1;
      in_stack_ffffffffffffffd0 = (CPpmd7z_RangeEnc *)((long)&in_stack_ffffffffffffffd0->Low + 1);
    }
    if (*(long *)(piVar1 + 0x12d0) != 0) {
      return 0;
    }
    if (*piVar1 == 1) {
      return 1;
    }
    *(undefined8 *)(piVar1 + 0x12cc) = *(undefined8 *)(piVar1 + 0x12ca);
  }
  while( true ) {
    bVar4 = false;
    if (in_RSI[1] != 0) {
      bVar4 = in_RSI[4] != 0;
    }
    if (!bVar4) break;
    *in_RSI = *in_RSI + 1;
    Ppmd7_EncodeSymbol(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    in_RSI[1] = in_RSI[1] + -1;
    in_RSI[2] = in_RSI[2] + 1;
  }
  if ((in_RSI[1] == 0) && (in_EDX == 0)) {
    Ppmd7z_RangeEnc_FlushData(in_stack_ffffffffffffffd0);
    *piVar1 = 1;
    if (*(long *)(piVar1 + 0x12d0) == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
compression_code_ppmd(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	struct ppmd_stream *strm;

	(void)a; /* UNUSED */

	strm = (struct ppmd_stream *)lastrm->real_stream;

	/* Copy encoded data if there are remaining bytes from previous call. */
	if (strm->buff_bytes) {
		uint8_t *p = strm->buff_ptr - strm->buff_bytes;
		while (lastrm->avail_out && strm->buff_bytes) {
			*lastrm->next_out++ = *p++;
			lastrm->avail_out--;
			lastrm->total_out++;
			strm->buff_bytes--;
		}
		if (strm->buff_bytes)
			return (ARCHIVE_OK);
		if (strm->stat == 1)
			return (ARCHIVE_EOF);
		strm->buff_ptr = strm->buff;
	}
	while (lastrm->avail_in && lastrm->avail_out) {
		__archive_ppmd7_functions.Ppmd7_EncodeSymbol(
			&(strm->ppmd7_context), &(strm->range_enc),
			*lastrm->next_in++);
		lastrm->avail_in--;
		lastrm->total_in++;
	}
	if (lastrm->avail_in == 0 && action == ARCHIVE_Z_FINISH) {
		__archive_ppmd7_functions.Ppmd7z_RangeEnc_FlushData(
			&(strm->range_enc));
		strm->stat = 1;
		/* Return EOF if there are no remaining bytes. */
		if (strm->buff_bytes == 0)
			return (ARCHIVE_EOF);
	}
	return (ARCHIVE_OK);
}